

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

void __thiscall
slang::ast::ExpressionVarVisitor::visit<slang::ast::InvalidAssertionExpr>
          (ExpressionVarVisitor *this,InvalidAssertionExpr *expr)

{
  InvalidAssertionExpr *expr_local;
  ExpressionVarVisitor *this_local;
  
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue: {
                    if (auto sym = expr.getSymbolReference()) {
                        if (VariableSymbol::isKind(sym->kind))
                            anyVars = true;
                    }
                    break;
                }
                default:
                    if constexpr (HasVisitExprs<T, ExpressionVarVisitor>) {
                        expr.visitExprs(*this);
                    }
                    break;
            }
        }
    }